

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_subsystem.c
# Opt level: O0

void oonf_subsystem_initiate_shutdown(void)

{
  list_entity *plVar1;
  list_entity *__tempptr_3;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  oonf_subsystem *iterator;
  oonf_subsystem *plugin;
  
  iterator = (oonf_subsystem *)(oonf_plugin_tree.list_head.next + -7);
  plVar1 = (oonf_plugin_tree.list_head.next)->next;
  while( true ) {
    __tempptr = plVar1 + -7;
    if ((iterator->_node).list.prev == oonf_plugin_tree.list_head.prev) break;
    if (iterator->initiate_shutdown != (_func_void *)0x0) {
      if ((log_global_mask[4] & 1) != 0) {
        oonf_log(LOG_SEVERITY_DEBUG,LOG_PLUGINS,"src/libcore/oonf_subsystem.c",0xdf,(void *)0x0,0,
                 "Initiate Shutdown: %s",iterator->name);
      }
      (*iterator->initiate_shutdown)();
    }
    iterator = (oonf_subsystem *)__tempptr;
    plVar1 = plVar1->next;
  }
  return;
}

Assistant:

void
oonf_subsystem_initiate_shutdown(void) {
  struct oonf_subsystem *plugin, *iterator;

  avl_for_each_element_safe(&oonf_plugin_tree, plugin, _node, iterator) {
    if (plugin->initiate_shutdown) {
      OONF_DEBUG(LOG_PLUGINS, "Initiate Shutdown: %s", plugin->name);
      plugin->initiate_shutdown();
    }
  }
}